

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.cpp
# Opt level: O0

error<idx2::mmap_err_code> idx2::FlushFile(mmap_file *MMap,byte *Start,i64 Bytes)

{
  error<idx2::mmap_err_code> eVar1;
  int local_68;
  int local_64;
  mmap_file *local_60;
  mmap_err_code local_58;
  undefined2 uStack_54;
  anon_class_1_0_00000001 local_49;
  mmap_file *local_48;
  mmap_err_code local_40;
  undefined2 uStack_3c;
  anon_class_1_0_00000001 local_35;
  int local_34;
  i64 iStack_30;
  int Result;
  i64 Bytes_local;
  byte *Start_local;
  mmap_file *MMap_local;
  mmap_err_code local_10;
  undefined2 uStack_c;
  undefined2 uStack_a;
  
  iStack_30 = Bytes;
  Bytes_local = (i64)Start;
  Start_local = (byte *)MMap;
  if (Start == (byte *)0x0) {
    if (Bytes == 0) {
      local_68 = msync((MMap->Buf).Data,(MMap->Buf).Bytes,1);
    }
    else {
      local_68 = msync((MMap->Buf).Data,Bytes,1);
    }
    local_34 = local_68;
  }
  else {
    if (Bytes == 0) {
      local_64 = msync(Start,(MMap->Buf).Bytes - ((long)Start - (long)(MMap->Buf).Data),1);
    }
    else {
      local_64 = msync(Start,Bytes,1);
    }
    local_34 = local_64;
  }
  if (local_34 == -1) {
    eVar1 = FlushFile::anon_class_1_0_00000001::operator()(&local_35);
    local_48 = (mmap_file *)eVar1.Msg;
    MMap_local = local_48;
    local_40 = eVar1.Code;
    local_10 = local_40;
    uStack_3c = eVar1._12_2_;
    uStack_c = uStack_3c;
  }
  else {
    eVar1 = FlushFile::anon_class_1_0_00000001::operator()(&local_49);
    local_60 = (mmap_file *)eVar1.Msg;
    MMap_local = local_60;
    local_58 = eVar1.Code;
    local_10 = local_58;
    uStack_54 = eVar1._12_2_;
    uStack_c = uStack_54;
  }
  eVar1.Code = local_10;
  eVar1.Msg = (cstr)MMap_local;
  eVar1.StackIdx = (undefined1)uStack_c;
  eVar1.StrGened = (bool)uStack_c._1_1_;
  eVar1._14_2_ = uStack_a;
  return eVar1;
}

Assistant:

error<mmap_err_code>
FlushFile(mmap_file* MMap, byte* Start, i64 Bytes)
{
#if defined(_WIN32)
  bool Result =
    Start ? FlushViewOfFile(Start, (size_t)Bytes) : FlushViewOfFile(MMap->Buf.Data, (size_t)Bytes);
  if (!Result)
    return idx2_Error(mmap_err_code::FlushFailed);
#elif defined(__CYGWIN__) || defined(__linux__) || defined(__APPLE__)
  int Result;
  if (Start)
  {
    idx2_Assert(MMap->Buf.Data <= Start && Start < MMap->Buf.Data + MMap->Buf.Bytes);
    idx2_Assert(Bytes <= (MMap->Buf.Data + MMap->Buf.Bytes) - Start);
    Result = Bytes ? msync(Start, Bytes, MS_ASYNC)
                   : msync(Start, MMap->Buf.Bytes - (Start - MMap->Buf.Data), MS_ASYNC);
  }
  else
  {
    idx2_Assert(Bytes <= MMap->Buf.Bytes);
    Result = Bytes ? msync(MMap->Buf.Data, Bytes, MS_ASYNC)
                   : msync(MMap->Buf.Data, MMap->Buf.Bytes, MS_ASYNC);
  }
  if (Result == -1)
    return idx2_Error(mmap_err_code::FlushFailed);
#endif
  return idx2_Error(mmap_err_code::NoError);
}